

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

CBString * uniqueItemName(CBString *__return_storage_ptr__,UModelIndex *index)

{
  bool bVar1;
  byte bVar2;
  UINT8 UVar3;
  UINT8 subtype;
  int iVar4;
  TreeModel *this;
  CBString local_1f0;
  CBString local_1d8;
  CBString local_1c0;
  CBString local_1a8;
  CBString local_190;
  undefined1 local_178 [8];
  CBString subtypeString;
  CBString local_148;
  CBString local_130;
  byte local_112;
  byte local_111;
  CBString local_110;
  CBString local_f8;
  CBString local_e0;
  undefined1 local_c8 [8];
  CBString fileText;
  UModelIndex fileIndex;
  CBString local_90;
  CBString local_78;
  byte local_5d;
  undefined1 local_50 [8];
  CBString itemText;
  CBString itemName;
  TreeModel *model;
  UModelIndex *index_local;
  CBString *name;
  
  bVar1 = UModelIndex::isValid(index);
  if (!bVar1) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"InvalidIndex");
    return __return_storage_ptr__;
  }
  this = UModelIndex::model(index);
  TreeModel::name((CBString *)&itemText.super_tagbstring.data,this,index);
  TreeModel::text((CBString *)local_50,this,index);
  local_5d = 0;
  Bstrlib::CBString::CBString(__return_storage_ptr__,(CBString *)&itemText.super_tagbstring.data);
  bVar2 = TreeModel::type(this,index);
  if (bVar2 != 0x42) {
    if (bVar2 == 0x43) {
      TreeModel::findParentOfType((UModelIndex *)&fileText.super_tagbstring.data,this,index,'B');
      TreeModel::text((CBString *)local_c8,this,(UModelIndex *)&fileText.super_tagbstring.data);
      local_111 = 0;
      local_112 = 0;
      bVar1 = Bstrlib::CBString::isEmpty((CBString *)local_c8);
      if (bVar1) {
        TreeModel::name(&local_e0,this,(UModelIndex *)&fileText.super_tagbstring.data);
      }
      else {
        TreeModel::name(&local_110,this,(UModelIndex *)&fileText.super_tagbstring.data);
        local_111 = 1;
        Bstrlib::CBString::operator+(&local_f8,&local_110,'_');
        local_112 = 1;
        Bstrlib::CBString::operator+(&local_e0,&local_f8,(CBString *)local_c8);
      }
      Bstrlib::CBString::operator=(__return_storage_ptr__,&local_e0);
      Bstrlib::CBString::~CBString(&local_e0);
      if ((local_112 & 1) != 0) {
        Bstrlib::CBString::~CBString(&local_f8);
      }
      if ((local_111 & 1) != 0) {
        Bstrlib::CBString::~CBString(&local_110);
      }
      UVar3 = TreeModel::subtype(this,index);
      if ((UVar3 == '\x02') || (UVar3 = TreeModel::subtype(this,index), UVar3 == '\x18')) {
        TreeModel::name((CBString *)&subtypeString.super_tagbstring.data,this,index);
        Bstrlib::CBString::operator+
                  (&local_148,(CBString *)&subtypeString.super_tagbstring.data,'_');
        Bstrlib::CBString::operator+(&local_130,&local_148,__return_storage_ptr__);
        Bstrlib::CBString::operator=(__return_storage_ptr__,&local_130);
        Bstrlib::CBString::~CBString(&local_130);
        Bstrlib::CBString::~CBString(&local_148);
        Bstrlib::CBString::~CBString((CBString *)&subtypeString.super_tagbstring.data);
      }
      Bstrlib::CBString::~CBString((CBString *)local_c8);
      goto LAB_00151755;
    }
    if (5 < bVar2 - 0x4f) goto LAB_00151755;
  }
  bVar1 = Bstrlib::CBString::isEmpty((CBString *)local_50);
  if (bVar1) {
    Bstrlib::CBString::CBString(&local_78,(CBString *)&itemText.super_tagbstring.data);
  }
  else {
    Bstrlib::CBString::operator+(&local_90,(CBString *)&itemText.super_tagbstring.data,'_');
    Bstrlib::CBString::operator+(&local_78,&local_90,(CBString *)local_50);
  }
  fileIndex.m._7_1_ = !bVar1;
  Bstrlib::CBString::operator=(__return_storage_ptr__,&local_78);
  Bstrlib::CBString::~CBString(&local_78);
  if (fileIndex.m._7_1_) {
    Bstrlib::CBString::~CBString(&local_90);
  }
LAB_00151755:
  UVar3 = TreeModel::type(this,index);
  subtype = TreeModel::subtype(this,index);
  itemSubtypeToUString((CBString *)local_178,UVar3,subtype);
  UVar3 = TreeModel::type(this,index);
  itemTypeToUString(&local_1d8,UVar3);
  iVar4 = Bstrlib::CBString::length((CBString *)local_178);
  if (iVar4 == 0) {
    Bstrlib::CBString::CBString(&local_1f0);
  }
  else {
    Bstrlib::operator+(&local_1f0,'_',(CBString *)local_178);
  }
  Bstrlib::CBString::operator+(&local_1c0,&local_1d8,&local_1f0);
  Bstrlib::CBString::operator+(&local_1a8,&local_1c0,'_');
  Bstrlib::CBString::operator+(&local_190,&local_1a8,__return_storage_ptr__);
  Bstrlib::CBString::operator=(__return_storage_ptr__,&local_190);
  Bstrlib::CBString::~CBString(&local_190);
  Bstrlib::CBString::~CBString(&local_1a8);
  Bstrlib::CBString::~CBString(&local_1c0);
  Bstrlib::CBString::~CBString(&local_1f0);
  Bstrlib::CBString::~CBString(&local_1d8);
  fixFileName(__return_storage_ptr__,true);
  local_5d = 1;
  Bstrlib::CBString::~CBString((CBString *)local_178);
  if ((local_5d & 1) == 0) {
    Bstrlib::CBString::~CBString(__return_storage_ptr__);
  }
  Bstrlib::CBString::~CBString((CBString *)local_50);
  Bstrlib::CBString::~CBString((CBString *)&itemText.super_tagbstring.data);
  return __return_storage_ptr__;
}

Assistant:

UString uniqueItemName(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return UString("InvalidIndex");
    
    // Get model from index
    const TreeModel* model = (const TreeModel*)index.model();
    
    // Construct the name
    UString itemName = model->name(index);
    UString itemText = model->text(index);
    
    // Default name
    UString name = itemName;
    switch (model->type(index)) {
        case Types::NvarEntry:
        case Types::VssEntry:
        case Types::SysFEntry:
        case Types::EvsaEntry:
        case Types::PhoenixFlashMapEntry:
        case Types::InsydeFlashDeviceMapEntry:
        case Types::File:
            name = itemText.isEmpty() ? itemName : itemName + '_' + itemText;
            break;
        case Types::Section: {
            // Get parent file name
            UModelIndex fileIndex = model->findParentOfType(index, Types::File);
            UString fileText = model->text(fileIndex);
            name = fileText.isEmpty() ? model->name(fileIndex) : model->name(fileIndex) + '_' + fileText;
            
            // Special case of GUIDed sections
            if (model->subtype(index) == EFI_SECTION_GUID_DEFINED || model->subtype(index) == EFI_SECTION_FREEFORM_SUBTYPE_GUID) {
                name = model->name(index) +'_' + name;
            }
        } break;
    }
    
    // Populate subtypeString
    UString subtypeString = itemSubtypeToUString(model->type(index), model->subtype(index));
    
    // Create final name
    name = itemTypeToUString(model->type(index))
    + (subtypeString.length() ? ('_' + subtypeString) : UString())
    + '_' + name;
    
    fixFileName(name, true);
    
    return name;
}